

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

double ON_Length3d(double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = ABS(x);
  dVar2 = ABS(y);
  dVar4 = ABS(z);
  if ((((dVar1 <= dVar2) && (dVar3 = dVar1, dVar5 = dVar2, dVar4 <= dVar2)) ||
      (dVar3 = dVar2, dVar5 = dVar1, dVar4 < dVar1)) || (dVar4 < dVar2)) {
    dVar1 = dVar4;
    dVar2 = dVar3;
    dVar4 = dVar5;
  }
  if (dVar4 <= 2.2250738585072014e-308) {
    if (dVar4 <= 0.0) {
      dVar4 = 0.0;
    }
  }
  else {
    dVar4 = dVar4 * SQRT((dVar1 / dVar4) * (dVar1 / dVar4) + (dVar2 / dVar4) * (dVar2 / dVar4) + 1.0
                        );
  }
  return dVar4;
}

Assistant:

double ON_Length3d(double x, double y, double z)
{
  double len;
  x = fabs(x);
  y = fabs(y);
  z = fabs(z);
  if ( y >= x && y >= z ) {
    len = x; x = y; y = len;
  }
  else if ( z >= x && z >= y ) {
    len = x; x = z; z = len;
  }

  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/x to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic vectors that have infinite length!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( x > ON_DBL_MIN ) 
  {
    y /= x;
    z /= x;
    len = x*sqrt(1.0 + y*y + z*z);
  }
  else if ( x > 0.0 && ON_IS_FINITE(x) )
    len = x;
  else
    len = 0.0;

  return len;
}